

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

ostream * std::operator<<(ostream *os,vector<bool,_std::allocator<bool>_> *vec)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RDI;
  const_reference *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<bool,_std::allocator<bool>_> *__range2;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  _Bit_iterator_base *in_stack_ffffffffffffffa0;
  
  vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x11b572);
  vector<bool,_std::allocator<bool>_>::end((vector<bool,_std::allocator<bool>_> *)0x11b597);
  while( true ) {
    bVar1 = operator!=(in_stack_ffffffffffffffa0,
                       (_Bit_iterator_base *)
                       CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    if (!bVar1) break;
    in_stack_ffffffffffffff9f =
         _Bit_const_iterator::operator*((_Bit_const_iterator *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 = (_Bit_iterator_base *)&stack0xffffffffffffff9f;
    poVar2 = (ostream *)std::ostream::operator<<(in_RDI,(bool)in_stack_ffffffffffffff9f);
    std::operator<<(poVar2,", ");
    _Bit_const_iterator::operator++((_Bit_const_iterator *)in_stack_ffffffffffffffa0);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}